

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_test.cc
# Opt level: O2

void __thiscall
BlockdTest_GetPartitionSubsize_Test::TestBody(BlockdTest_GetPartitionSubsize_Test *this)

{
  long lVar1;
  uint uVar2;
  BLOCK_SIZE (*paBVar3) [22];
  pointer *__ptr;
  SEARCH_METHODS *message;
  ulong uVar4;
  ulong uStack_60;
  Message local_58;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  paBVar3 = TestBody::kPartitionSubsize;
  lVar1 = 0;
  do {
    if (lVar1 == 10) {
      return;
    }
    for (uVar4 = 0; uVar4 != 0x16; uVar4 = uVar4 + 1) {
      local_58.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = BLOCK_INVALID;
      if (9 < (byte)uVar4) {
        uVar2 = (uint)uVar4 & 0xff;
        if (uVar2 == 0xc) {
          uStack_60 = 4;
        }
        else {
          if (uVar2 != 0xf) goto switchD_00429773_caseD_1;
          uStack_60 = 5;
        }
        goto switchD_00429773_caseD_0;
      }
      uStack_60 = uVar4 & 0xff;
      switch(uStack_60) {
      case 0:
        break;
      default:
        goto switchD_00429773_caseD_1;
      case 3:
        uStack_60 = 1;
        break;
      case 6:
        uStack_60 = 2;
        break;
      case 9:
        uStack_60 = 3;
      }
switchD_00429773_caseD_0:
      local_58.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = subsize_lookup[lVar1][uStack_60];
switchD_00429773_caseD_1:
      testing::internal::CmpHelperEQ<BLOCK_SIZE,BLOCK_SIZE>
                ((internal *)&gtest_ar,"kPartitionSubsize[partition][bsize]",
                 "get_partition_subsize(static_cast<BLOCK_SIZE>(bsize), static_cast<PARTITION_TYPE>(partition))"
                 ,*paBVar3 + uVar4,(BLOCK_SIZE *)&local_58);
      if (gtest_ar.success_ == false) {
        testing::Message::Message(&local_58);
        message = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = *(SEARCH_METHODS **)
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/block_test.cc"
                   ,0x7c,(char *)message);
        testing::internal::AssertHelper::operator=(&local_38,&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((long *)CONCAT71(local_58.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             (BLOCK_SIZE)
                             local_58.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_58.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._1_7_,
                                         (BLOCK_SIZE)
                                         local_58.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
    }
    lVar1 = lVar1 + 1;
    paBVar3 = paBVar3 + 1;
  } while( true );
}

Assistant:

TEST(BlockdTest, GetPartitionSubsize) {
  // The Partition_Subsize table in the spec (Section 9.3. Conversion tables).
  /* clang-format off */
  static const BLOCK_SIZE kPartitionSubsize[10][BLOCK_SIZES_ALL] = {
    {
                                    BLOCK_4X4,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_8X8,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_16X16,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_32X32,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_64X64,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_128X128,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID
    }, {
                                    BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_8X4,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_16X8,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_32X16,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_64X32,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_128X64,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID
    }, {
                                    BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_4X8,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_8X16,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_16X32,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_32X64,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_64X128,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID
    }, {
                                    BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_4X4,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_8X8,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_16X16,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_32X32,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_64X64,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID
    }, {
                                    BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_16X8,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_32X16,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_64X32,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_128X64,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID
    }, {
                                    BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_16X8,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_32X16,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_64X32,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_128X64,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID
    }, {
                                    BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_8X16,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_16X32,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_32X64,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_64X128,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID
    }, {
                                    BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_8X16,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_16X32,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_32X64,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_64X128,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID
    }, {
                                    BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_16X4,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_32X8,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_64X16,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID
    }, {
                                    BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_4X16,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_8X32,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_16X64,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID,
      BLOCK_INVALID, BLOCK_INVALID, BLOCK_INVALID
    }
  };
  /* clang-format on */

  for (int partition = 0; partition < 10; partition++) {
    for (int bsize = BLOCK_4X4; bsize < BLOCK_SIZES_ALL; bsize++) {
      EXPECT_EQ(kPartitionSubsize[partition][bsize],
                get_partition_subsize(static_cast<BLOCK_SIZE>(bsize),
                                      static_cast<PARTITION_TYPE>(partition)));
    }
  }
}